

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O1

void __thiscall
amrex::NFilesIter::NFilesIter
          (NFilesIter *this,string *filename,Vector<int,_std::allocator<int>_> *readranks,
          bool setBuf)

{
  undefined8 uVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer piVar4;
  long lVar5;
  
  (this->fullFileName)._M_dataplus._M_p = (pointer)&(this->fullFileName).field_2;
  (this->fullFileName)._M_string_length = 0;
  (this->fullFileName).field_2._M_local_buf[0] = '\0';
  (this->filePrefix)._M_dataplus._M_p = (pointer)&(this->filePrefix).field_2;
  (this->filePrefix)._M_string_length = 0;
  (this->filePrefix).field_2._M_local_buf[0] = '\0';
  (this->io_buffer).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->io_buffer).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->io_buffer).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::fstream::fstream(&this->fileStream);
  (this->sparseWritingRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->sparseWritingRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->sparseWritingRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->unreadMessages).super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreadMessages).super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreadMessages).super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->readRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->readRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->readRanks).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->fileNumbersWriteOrder).
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fileNumbersWriteOrder).
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fileNumbersWriteOrder).
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->availableDeciders).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->availableDeciders).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->availableDeciders).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->setZeroProcs).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->setZeroProcs).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->setZeroProcs).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  this->isReading = true;
  uVar1 = *(undefined8 *)(ParallelContext::frames + 0xc);
  this->myProc = (int)uVar1;
  this->nProcs = (int)((ulong)uVar1 >> 0x20);
  std::__cxx11::string::_M_assign((string *)&this->fullFileName);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->readRanks).super_vector<int,_std::allocator<int>_>,
             &readranks->super_vector<int,_std::allocator<int>_>);
  this->myReadIndex = -1;
  piVar4 = (this->readRanks).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->readRanks).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 != piVar4 && -1 < (long)piVar2 - (long)piVar4) {
    lVar5 = 0;
    do {
      if (this->myProc == piVar4[lVar5]) {
        if (this->myReadIndex != -1) {
          Abort_host("**** Error in NFilesIter:  readRanks not unique.");
        }
        this->myReadIndex = (int)lVar5;
      }
      lVar5 = lVar5 + 1;
      piVar4 = (this->readRanks).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (lVar5 < (long)(this->readRanks).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
  }
  if (this->myReadIndex == -1) {
    this->finishedReading = true;
  }
  else {
    this->finishedReading = false;
    if (setBuf) {
      std::vector<char,_std::allocator<char>_>::resize
                (&(this->io_buffer).super_vector<char,_std::allocator<char>_>,
                 VisMFBuffer::ioBufferSize);
      pcVar3 = (this->io_buffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (**(code **)(*(long *)&this->field_0x88 + 0x18))
                (&this->field_0x88,pcVar3,
                 (long)(this->io_buffer).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pcVar3);
    }
    this->useStaticSetSelection = true;
  }
  return;
}

Assistant:

NFilesIter::NFilesIter(const std::string &filename,
                       const Vector<int> &readranks,
                       bool setBuf)
{
  isReading = true;
  myProc    = ParallelDescriptor::MyProc();
  nProcs    = ParallelDescriptor::NProcs();
  fullFileName = filename;
  readRanks = readranks;
  myReadIndex = indexUndefined;
  for(int i(0); i < readRanks.size(); ++i) {
    if(myProc == readRanks[i]) {
      if(myReadIndex != indexUndefined) {
        amrex::Abort("**** Error in NFilesIter:  readRanks not unique.");
      }
      myReadIndex = i;
    }
  }

  if(myReadIndex == indexUndefined) {  // ---- nothing to read
    finishedReading = true;
    return;
  } else {
    finishedReading = false;
  }

  if(setBuf) {
    io_buffer.resize(VisMFBuffer::GetIOBufferSize());
    fileStream.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
  }

  useStaticSetSelection = true;
}